

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_utils.c
# Opt level: O0

size_t ht_event_utils_serialize_event_to_buffer
                 (HT_Event *event,HT_Byte *buffer,HT_Boolean serialize)

{
  HT_EventKlass *pHVar1;
  HT_EventKlass *klass;
  HT_Boolean serialize_local;
  HT_Byte *buffer_local;
  HT_Event *event_local;
  
  pHVar1 = event->klass;
  if (serialize == 0) {
    memcpy(buffer,event,pHVar1->type_info->size);
    event_local = (HT_Event *)pHVar1->type_info->size;
  }
  else {
    event_local = (HT_Event *)(*pHVar1->serialize)(event,buffer);
  }
  return (size_t)event_local;
}

Assistant:

size_t
ht_event_utils_serialize_event_to_buffer(HT_Event* event, HT_Byte* buffer, HT_Boolean serialize)
{
    HT_EventKlass* klass = HT_EVENT_GET_KLASS(event);

    if (serialize)
    {
        return klass->serialize(event, buffer);
    }
    else
    {
        memcpy(buffer, event, klass->type_info->size);
        return klass->type_info->size;
    }
}